

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayoutPrivate::recalcHFW(QFormLayoutPrivate *this,int w)

{
  int iVar1;
  const_reference pQVar2;
  int *piVar3;
  int in_ESI;
  QList<QLayoutStruct> *in_RDI;
  long in_FS_OFFSET;
  int spacing;
  int r;
  int mh;
  int h;
  qsizetype in_stack_ffffffffffffffc8;
  int local_20;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  setupHfwLayoutData(_mh);
  local_c = 0;
  local_10 = 0;
  for (local_20 = 0; local_20 < *(int *)&in_RDI[0xd].d.ptr; local_20 = local_20 + 1) {
    pQVar2 = QList<QLayoutStruct>::at(in_RDI,in_stack_ffffffffffffffc8);
    iVar1 = pQVar2->spacing;
    pQVar2 = QList<QLayoutStruct>::at(in_RDI,in_stack_ffffffffffffffc8);
    local_c = pQVar2->sizeHint + iVar1 + local_c;
    pQVar2 = QList<QLayoutStruct>::at(in_RDI,in_stack_ffffffffffffffc8);
    local_10 = pQVar2->minimumSize + iVar1 + local_10;
  }
  if ((*(int *)&in_RDI[0xb].d.d < 1) || (*(int *)&in_RDI[0xb].d.d != in_ESI)) {
    *(int *)((long)&in_RDI[10].d.d + 4) = in_ESI;
    piVar3 = qMin<int>(&QLAYOUTSIZE_MAX,&local_c);
    *(int *)&in_RDI[10].d.ptr = *piVar3;
  }
  else {
    piVar3 = qMin<int>(&QLAYOUTSIZE_MAX,&local_c);
    *(int *)((long)&in_RDI[10].d.ptr + 4) = *piVar3;
    piVar3 = qMin<int>(&QLAYOUTSIZE_MAX,&local_10);
    *(int *)&in_RDI[10].d.size = *piVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayoutPrivate::recalcHFW(int w)
{
    setupHfwLayoutData();

    int h = 0;
    int mh = 0;

    for (int r = 0; r < vLayoutCount; ++r) {
        int spacing = hfwLayouts.at(r).spacing;
        h += hfwLayouts.at(r).sizeHint + spacing;
        mh += hfwLayouts.at(r).minimumSize + spacing;
    }

    if (sh_width > 0 && sh_width == w) {
        hfw_sh_height = qMin(QLAYOUTSIZE_MAX, h);
        hfw_sh_minheight = qMin(QLAYOUTSIZE_MAX, mh);
    } else {
        hfw_width = w;
        hfw_height = qMin(QLAYOUTSIZE_MAX, h);
    }
}